

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

Vector * __thiscall fasttext::Vector::operator=(Vector *this,Vector *other)

{
  std::vector<float,_std::allocator<float>_>::_M_move_assign();
  return this;
}

Assistant:

Vector& Vector::operator=(Vector&& other) {
  data_ = std::move(other.data_);
  return *this;
}